

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O0

bool WaitForSession(SSL *ssl,int sock)

{
  bool bVar1;
  int ret_code;
  int ssl_err_00;
  int ssl_err;
  int ssl_ret;
  uint8_t buffer [512];
  int ret;
  fd_set *__arr;
  undefined1 local_a0 [4];
  uint __i;
  fd_set read_fds;
  int sock_local;
  SSL *ssl_local;
  
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(undefined8 *)(local_a0 + (ulong)__arr._4_4_ * 8) = 0;
  }
  read_fds.fds_bits[0xf]._4_4_ = sock;
  bVar1 = SocketSetNonBlocking(sock,true);
  if (bVar1) {
    do {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&resume_session);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return true;
      }
      *(ulong *)(local_a0 + (long)(read_fds.fds_bits[0xf]._4_4_ / 0x40) * 8) =
           1L << ((byte)((long)read_fds.fds_bits[0xf]._4_4_ % 0x40) & 0x3f) |
           *(ulong *)(local_a0 + (long)(read_fds.fds_bits[0xf]._4_4_ / 0x40) * 8);
      buffer._508_4_ =
           select(read_fds.fds_bits[0xf]._4_4_ + 1,(fd_set *)local_a0,(fd_set *)0x0,(fd_set *)0x0,
                  (timeval *)0x0);
      if ((int)buffer._508_4_ < 1) {
        perror("select");
        return false;
      }
      ret_code = SSL_read((SSL *)ssl,&ssl_err,0x200);
    } while ((0 < ret_code) || (ssl_err_00 = SSL_get_error((SSL *)ssl,ret_code), ssl_err_00 == 2));
    PrintSSLError(_stderr,"Error while reading",ssl_err_00,ret_code);
  }
  return false;
}

Assistant:

static bool WaitForSession(SSL *ssl, int sock) {
  fd_set read_fds;
  FD_ZERO(&read_fds);

  if (!SocketSetNonBlocking(sock, true)) {
    return false;
  }

  while (!resume_session) {
#if defined(OPENSSL_WINDOWS)
    // Windows sockets are really of type SOCKET, not int, but everything here
    // casts them to ints. Clang gets unhappy about signed values as a result.
    //
    // TODO(davidben): Keep everything as the appropriate platform type.
    FD_SET(static_cast<SOCKET>(sock), &read_fds);
#else
    FD_SET(sock, &read_fds);
#endif
    int ret = select(sock + 1, &read_fds, NULL, NULL, NULL);
    if (ret <= 0) {
      perror("select");
      return false;
    }

    uint8_t buffer[512];
    int ssl_ret = SSL_read(ssl, buffer, sizeof(buffer));

    if (ssl_ret <= 0) {
      int ssl_err = SSL_get_error(ssl, ssl_ret);
      if (ssl_err == SSL_ERROR_WANT_READ) {
        continue;
      }
      PrintSSLError(stderr, "Error while reading", ssl_err, ssl_ret);
      return false;
    }
  }

  return true;
}